

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::SwitchStmt::remove_switch_case
          (SwitchStmt *this,shared_ptr<kratos::Const> *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  bool bVar1;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  mapped_type *stmts;
  _Self local_28;
  shared_ptr<kratos::Stmt> *local_20;
  shared_ptr<kratos::Stmt> *stmt_local;
  shared_ptr<kratos::Const> *switch_case_local;
  SwitchStmt *this_local;
  
  local_20 = stmt;
  stmt_local = (shared_ptr<kratos::Stmt> *)switch_case;
  switch_case_local = (shared_ptr<kratos::Const> *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
       ::find(&this->body_,switch_case);
  stmts = (mapped_type *)
          std::
          map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
          ::end(&this->body_);
  bVar1 = std::operator!=(&local_28,(_Self *)&stmts);
  if (bVar1) {
    this_00 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 ::at(&this->body_,(key_type *)stmt_local);
    peVar2 = std::
             __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[10])(peVar2,local_20);
  }
  return;
}

Assistant:

void SwitchStmt::remove_switch_case(const std::shared_ptr<kratos::Const> &switch_case,
                                    const std::shared_ptr<kratos::Stmt> &stmt) {
    if (body_.find(switch_case) != body_.end()) {
        auto &stmts = body_.at(switch_case);
        stmts->remove_stmt(stmt);
    }
}